

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

char * ucnv_detectUnicodeSignature_63
                 (char *source,int32_t sourceLength,int32_t *signatureLength,UErrorCode *pErrorCode)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  bool bVar6;
  undefined4 local_20;
  char local_1c;
  
  local_1c = -0x5b;
  local_20 = 0xa5a5a5a5;
  if ((pErrorCode == (UErrorCode *)0x0) || (U_ZERO_ERROR < *pErrorCode)) {
    return (char *)0x0;
  }
  if (source == (char *)0x0 || sourceLength < -1) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (char *)0x0;
  }
  if (sourceLength == -1) {
    sVar2 = strlen(source);
    sourceLength = (int32_t)sVar2;
  }
  if (sourceLength < 1) {
    cVar1 = -0x5b;
    bVar6 = false;
    cVar4 = -0x5b;
  }
  else {
    uVar5 = 4;
    if (sourceLength - 1U < 4) {
      uVar5 = sourceLength - 1U;
    }
    memcpy(&local_20,source,(ulong)(uVar5 + 1));
    if (local_20._1_1_ == -1 && (char)local_20 == -2) {
      pcVar3 = "UTF-16BE";
LAB_0031a1f9:
      if (signatureLength != (int32_t *)0x0) {
        *signatureLength = 2;
        return pcVar3;
      }
      return pcVar3;
    }
    bVar6 = local_20._1_1_ == -2;
    if ((char)local_20 == -1 && bVar6) {
      if (local_20._3_1_ != '\0' || local_20._2_1_ != '\0') {
        pcVar3 = "UTF-16LE";
        goto LAB_0031a1f9;
      }
      pcVar3 = "UTF-32LE";
      goto LAB_0031a261;
    }
    cVar4 = local_20._1_1_;
    cVar1 = (char)local_20;
    if (local_20._2_1_ == -0x41 && (local_20._1_1_ == -0x45 && (char)local_20 == -0x11)) {
      pcVar3 = "UTF-8";
      goto LAB_0031a2e4;
    }
  }
  if (local_20._3_1_ == 0xff && (local_20._2_1_ == -2 && (cVar1 == '\0' && cVar4 == '\0'))) {
    pcVar3 = "UTF-32BE";
    goto LAB_0031a261;
  }
  if ((bool)(local_20._2_1_ == -1 & cVar1 == '\x0e' & bVar6)) {
    pcVar3 = "SCSU";
  }
  else {
    if (local_20._2_1_ != '(' || (cVar4 != -0x12 || cVar1 != -5)) {
      if (local_20._2_1_ == 'v' && (cVar4 == '/' && cVar1 == '+')) {
        if ((local_20._3_1_ == 0x38) && (local_1c == '-')) {
          if (signatureLength != (int32_t *)0x0) {
            *signatureLength = 5;
            return "UTF-7";
          }
          return "UTF-7";
        }
        if ((local_20._3_1_ < 0x3a) &&
           ((0x300880000000000U >> ((ulong)local_20._3_1_ & 0x3f) & 1) != 0)) {
          pcVar3 = "UTF-7";
LAB_0031a261:
          if (signatureLength != (int32_t *)0x0) {
            *signatureLength = 4;
            return pcVar3;
          }
          return pcVar3;
        }
      }
      else if (local_20._3_1_ == 0x73 && (local_20._2_1_ == 'f' && (cVar4 == 's' && cVar1 == -0x23))
              ) {
        pcVar3 = "UTF-EBCDIC";
        goto LAB_0031a261;
      }
      if (signatureLength == (int32_t *)0x0) {
        return (char *)0x0;
      }
      *signatureLength = 0;
      return (char *)0x0;
    }
    pcVar3 = "BOCU-1";
  }
LAB_0031a2e4:
  if (signatureLength != (int32_t *)0x0) {
    *signatureLength = 3;
    return pcVar3;
  }
  return pcVar3;
}

Assistant:

U_CAPI const char* U_EXPORT2
ucnv_detectUnicodeSignature( const char* source,
                             int32_t sourceLength,
                             int32_t* signatureLength,
                             UErrorCode* pErrorCode) {
    int32_t dummy;

    /* initial 0xa5 bytes: make sure that if we read <SIG_MAX_LEN
     * bytes we don't misdetect something 
     */
    char start[SIG_MAX_LEN]={ '\xa5', '\xa5', '\xa5', '\xa5', '\xa5' };
    int i = 0;

    if((pErrorCode==NULL) || U_FAILURE(*pErrorCode)){
        return NULL;
    }
    
    if(source == NULL || sourceLength < -1){
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(signatureLength == NULL) {
        signatureLength = &dummy;
    }

    if(sourceLength==-1){
        sourceLength=(int32_t)uprv_strlen(source);
    }

    
    while(i<sourceLength&& i<SIG_MAX_LEN){
        start[i]=source[i];
        i++;
    }

    if(start[0] == '\xFE' && start[1] == '\xFF') {
        *signatureLength=2;
        return  "UTF-16BE";
    } else if(start[0] == '\xFF' && start[1] == '\xFE') {
        if(start[2] == '\x00' && start[3] =='\x00') {
            *signatureLength=4;
            return "UTF-32LE";
        } else {
            *signatureLength=2;
            return  "UTF-16LE";
        }
    } else if(start[0] == '\xEF' && start[1] == '\xBB' && start[2] == '\xBF') {
        *signatureLength=3;
        return  "UTF-8";
    } else if(start[0] == '\x00' && start[1] == '\x00' && 
              start[2] == '\xFE' && start[3]=='\xFF') {
        *signatureLength=4;
        return  "UTF-32BE";
    } else if(start[0] == '\x0E' && start[1] == '\xFE' && start[2] == '\xFF') {
        *signatureLength=3;
        return "SCSU";
    } else if(start[0] == '\xFB' && start[1] == '\xEE' && start[2] == '\x28') {
        *signatureLength=3;
        return "BOCU-1";
    } else if(start[0] == '\x2B' && start[1] == '\x2F' && start[2] == '\x76') {
        /*
         * UTF-7: Initial U+FEFF is encoded as +/v8  or  +/v9  or  +/v+  or  +/v/
         * depending on the second UTF-16 code unit.
         * Detect the entire, closed Unicode mode sequence +/v8- for only U+FEFF
         * if it occurs.
         *
         * So far we have +/v
         */
        if(start[3] == '\x38' && start[4] == '\x2D') {
            /* 5 bytes +/v8- */
            *signatureLength=5;
            return "UTF-7";
        } else if(start[3] == '\x38' || start[3] == '\x39' || start[3] == '\x2B' || start[3] == '\x2F') {
            /* 4 bytes +/v8  or  +/v9  or  +/v+  or  +/v/ */
            *signatureLength=4;
            return "UTF-7";
        }
    }else if(start[0]=='\xDD' && start[1]== '\x73'&& start[2]=='\x66' && start[3]=='\x73'){
        *signatureLength=4;
        return "UTF-EBCDIC";
    }


    /* no known Unicode signature byte sequence recognized */
    *signatureLength=0;
    return NULL;
}